

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomBernoulliDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_randombernoullidynamic
          (NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  RandomBernoulliDynamicLayerParams *pRVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_randombernoullidynamic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randombernoullidynamic(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pRVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::RandomBernoulliDynamicLayerParams>(arena);
    (this->layer_).randombernoullidynamic_ = pRVar2;
  }
  return (RandomBernoulliDynamicLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomBernoulliDynamicLayerParams* NeuralNetworkLayer::_internal_mutable_randombernoullidynamic() {
  if (!_internal_has_randombernoullidynamic()) {
    clear_layer();
    set_has_randombernoullidynamic();
    layer_.randombernoullidynamic_ = CreateMaybeMessage< ::CoreML::Specification::RandomBernoulliDynamicLayerParams >(GetArenaForAllocation());
  }
  return layer_.randombernoullidynamic_;
}